

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

bool Js::IntlEngineInterfaceExtensionObject::InitializeIntlNativeInterfaces
               (DynamicObject *intlNativeInterfaces,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  PropertyRecord *propertyRecord;
  JavascriptSymbol *value;
  DynamicObject *pDVar2;
  JavascriptBoolean *value_00;
  DynamicObject *enumObj;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  int initSlotCapacity;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *intlNativeInterfaces_local;
  Var local_298;
  Var local_280;
  Var local_268;
  Var local_250;
  Var local_238;
  Var local_220;
  Var local_208;
  Var local_1f0;
  Var local_1d8;
  Var local_1c0;
  Var local_1a8;
  Var local_190;
  Var local_178;
  Var local_160;
  Var local_148;
  Var local_130;
  Var local_118;
  Var local_100;
  Var local_e8;
  Var local_d0;
  Var local_b8;
  Var local_a0;
  Var local_88;
  Var local_70;
  Var local_58;
  Var local_40;
  Var local_28;
  Var local_10;
  
  DeferredTypeHandlerBase::Convert(typeHandler,intlNativeInterfaces,mode,0x23,0);
  this = RecyclableObject::GetScriptContext(&intlNativeInterfaces->super_RecyclableObject);
  this_00 = ScriptContext::GetLibrary(this);
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1ec,(FunctionInfo *)EntryInfo::Intl_RaiseAssert,1,'\x06'
            );
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1ed,
             (FunctionInfo *)EntryInfo::Intl_IsWellFormedLanguageTag,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1ee,(FunctionInfo *)EntryInfo::Intl_NormalizeLanguageTag
             ,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1ef,(FunctionInfo *)EntryInfo::Intl_IsDTFLocaleAvailable
             ,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1f0,
             (FunctionInfo *)EntryInfo::Intl_IsCollatorLocaleAvailable,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1f1,(FunctionInfo *)EntryInfo::Intl_IsNFLocaleAvailable,
             1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1f2,(FunctionInfo *)EntryInfo::Intl_IsPRLocaleAvailable,
             1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,499,(FunctionInfo *)EntryInfo::Intl_ResolveLocaleLookup,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,500,(FunctionInfo *)EntryInfo::Intl_ResolveLocaleBestFit,1
             ,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1f5,(FunctionInfo *)EntryInfo::Intl_GetDefaultLocale,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1f6,(FunctionInfo *)EntryInfo::Intl_GetExtensions,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1f7,(FunctionInfo *)EntryInfo::Intl_CompareString,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1f8,(FunctionInfo *)EntryInfo::Intl_FormatNumber,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1f9,(FunctionInfo *)EntryInfo::Intl_CacheNumberFormat,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1fa,(FunctionInfo *)EntryInfo::Intl_CreateDateTimeFormat
             ,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1fb,(FunctionInfo *)EntryInfo::Intl_CurrencyDigits,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1fc,(FunctionInfo *)EntryInfo::Intl_FormatDateTime,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1fd,
             (FunctionInfo *)EntryInfo::Intl_ValidateAndCanonicalizeTimeZone,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1fe,(FunctionInfo *)EntryInfo::Intl_GetDefaultTimeZone,1
             ,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x1ff,
             (FunctionInfo *)EntryInfo::Intl_GetPatternForSkeleton,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x200,(FunctionInfo *)EntryInfo::Intl_GetLocaleData,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x201,(FunctionInfo *)EntryInfo::Intl_LocaleCompare,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x202,(FunctionInfo *)EntryInfo::Intl_PluralRulesSelect,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x203,(FunctionInfo *)EntryInfo::Intl_PluralRulesKeywords,
             1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x204,
             (FunctionInfo *)EntryInfo::Intl_RegisterBuiltInFunction,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x205,(FunctionInfo *)EntryInfo::Intl_GetHiddenObject,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this_00,intlNativeInterfaces,0x206,(FunctionInfo *)EntryInfo::Intl_SetHiddenObject,1,
             '\x06');
  propertyRecord =
       BuiltInPropertyRecord::operator_cast_to_PropertyRecord_
                 ((BuiltInPropertyRecord *)BuiltInPropertyRecords::_intlFallbackSymbol);
  value = JavascriptLibrary::CreateSymbol(this_00,propertyRecord);
  JavascriptLibrary::AddMember(this_00,intlNativeInterfaces,0x230,value);
  pDVar2 = JavascriptLibrary::CreateObject(this_00,false,0);
  bVar1 = TaggedInt::IsOverflow(0);
  if (bVar1) {
    local_10 = JavascriptNumber::NewInlined(0.0,this);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(0);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x216,local_10);
  bVar1 = TaggedInt::IsOverflow(1);
  if (bVar1) {
    local_28 = JavascriptNumber::NewInlined(1.0,this);
  }
  else {
    local_28 = TaggedInt::ToVarUnchecked(1);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x218,local_28);
  bVar1 = TaggedInt::IsOverflow(2);
  if (bVar1) {
    local_40 = JavascriptNumber::NewInlined(2.0,this);
  }
  else {
    local_40 = TaggedInt::ToVarUnchecked(2);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x217,local_40);
  bVar1 = TaggedInt::IsOverflow(3);
  if (bVar1) {
    local_58 = JavascriptNumber::NewInlined(3.0,this);
  }
  else {
    local_58 = TaggedInt::ToVarUnchecked(3);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x21a,local_58);
  bVar1 = TaggedInt::IsOverflow(4);
  if (bVar1) {
    local_70 = JavascriptNumber::NewInlined(4.0,this);
  }
  else {
    local_70 = TaggedInt::ToVarUnchecked(4);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x219,local_70);
  bVar1 = TaggedInt::IsOverflow(5);
  if (bVar1) {
    local_88 = JavascriptNumber::NewInlined(5.0,this);
  }
  else {
    local_88 = TaggedInt::ToVarUnchecked(5);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x21b,local_88);
  JavascriptLibrary::AddMember(this_00,intlNativeInterfaces,0x229,pDVar2);
  pDVar2 = JavascriptLibrary::CreateObject(this_00,false,0);
  bVar1 = TaggedInt::IsOverflow(2);
  if (bVar1) {
    local_a0 = JavascriptNumber::NewInlined(2.0,this);
  }
  else {
    local_a0 = TaggedInt::ToVarUnchecked(2);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x6e,local_a0);
  bVar1 = TaggedInt::IsOverflow(0);
  if (bVar1) {
    local_b8 = JavascriptNumber::NewInlined(0.0,this);
  }
  else {
    local_b8 = TaggedInt::ToVarUnchecked(0);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x21c,local_b8);
  bVar1 = TaggedInt::IsOverflow(1);
  if (bVar1) {
    local_d0 = JavascriptNumber::NewInlined(1.0,this);
  }
  else {
    local_d0 = TaggedInt::ToVarUnchecked(1);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x21d,local_d0);
  bVar1 = TaggedInt::IsOverflow(2);
  if (bVar1) {
    local_e8 = JavascriptNumber::NewInlined(2.0,this);
  }
  else {
    local_e8 = TaggedInt::ToVarUnchecked(2);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x84,local_e8);
  JavascriptLibrary::AddMember(this_00,intlNativeInterfaces,0x228,pDVar2);
  pDVar2 = JavascriptLibrary::CreateObject(this_00,false,0);
  bVar1 = TaggedInt::IsOverflow(3);
  if (bVar1) {
    local_100 = JavascriptNumber::NewInlined(3.0,this);
  }
  else {
    local_100 = TaggedInt::ToVarUnchecked(3);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x6e,local_100);
  bVar1 = TaggedInt::IsOverflow(0);
  if (bVar1) {
    local_118 = JavascriptNumber::NewInlined(0.0,this);
  }
  else {
    local_118 = TaggedInt::ToVarUnchecked(0);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x21e,local_118);
  bVar1 = TaggedInt::IsOverflow(1);
  if (bVar1) {
    local_130 = JavascriptNumber::NewInlined(1.0,this);
  }
  else {
    local_130 = TaggedInt::ToVarUnchecked(1);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x21f,local_130);
  bVar1 = TaggedInt::IsOverflow(2);
  if (bVar1) {
    local_148 = JavascriptNumber::NewInlined(2.0,this);
  }
  else {
    local_148 = TaggedInt::ToVarUnchecked(2);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x220,local_148);
  bVar1 = TaggedInt::IsOverflow(3);
  if (bVar1) {
    local_160 = JavascriptNumber::NewInlined(3.0,this);
  }
  else {
    local_160 = TaggedInt::ToVarUnchecked(3);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x221,local_160);
  JavascriptLibrary::AddMember(this_00,intlNativeInterfaces,0x227,pDVar2);
  pDVar2 = JavascriptLibrary::CreateObject(this_00,false,0);
  bVar1 = TaggedInt::IsOverflow(0);
  if (bVar1) {
    local_178 = JavascriptNumber::NewInlined(0.0,this);
  }
  else {
    local_178 = TaggedInt::ToVarUnchecked(0);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x6e,local_178);
  bVar1 = TaggedInt::IsOverflow(0);
  if (bVar1) {
    local_190 = JavascriptNumber::NewInlined(0.0,this);
  }
  else {
    local_190 = TaggedInt::ToVarUnchecked(0);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x165,local_190);
  bVar1 = TaggedInt::IsOverflow(1);
  if (bVar1) {
    local_1a8 = JavascriptNumber::NewInlined(1.0,this);
  }
  else {
    local_1a8 = TaggedInt::ToVarUnchecked(1);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x222,local_1a8);
  bVar1 = TaggedInt::IsOverflow(2);
  if (bVar1) {
    local_1c0 = JavascriptNumber::NewInlined(2.0,this);
  }
  else {
    local_1c0 = TaggedInt::ToVarUnchecked(2);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x106,local_1c0);
  JavascriptLibrary::AddMember(this_00,intlNativeInterfaces,0x226,pDVar2);
  pDVar2 = JavascriptLibrary::CreateObject(this_00,false,0);
  bVar1 = TaggedInt::IsOverflow(0);
  if (bVar1) {
    local_1d8 = JavascriptNumber::NewInlined(0.0,this);
  }
  else {
    local_1d8 = TaggedInt::ToVarUnchecked(0);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x6e,local_1d8);
  bVar1 = TaggedInt::IsOverflow(0);
  if (bVar1) {
    local_1f0 = JavascriptNumber::NewInlined(0.0,this);
  }
  else {
    local_1f0 = TaggedInt::ToVarUnchecked(0);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x223,local_1f0);
  bVar1 = TaggedInt::IsOverflow(1);
  if (bVar1) {
    local_208 = JavascriptNumber::NewInlined(1.0,this);
  }
  else {
    local_208 = TaggedInt::ToVarUnchecked(1);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x224,local_208);
  bVar1 = TaggedInt::IsOverflow(2);
  if (bVar1) {
    local_220 = JavascriptNumber::NewInlined(2.0,this);
  }
  else {
    local_220 = TaggedInt::ToVarUnchecked(2);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x240,local_220);
  JavascriptLibrary::AddMember(this_00,intlNativeInterfaces,0x225,pDVar2);
  pDVar2 = JavascriptLibrary::CreateObject(this_00,false,0);
  bVar1 = TaggedInt::IsOverflow(0);
  if (bVar1) {
    local_238 = JavascriptNumber::NewInlined(0.0,this);
  }
  else {
    local_238 = TaggedInt::ToVarUnchecked(0);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x22a,local_238);
  bVar1 = TaggedInt::IsOverflow(1);
  if (bVar1) {
    local_250 = JavascriptNumber::NewInlined(1.0,this);
  }
  else {
    local_250 = TaggedInt::ToVarUnchecked(1);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x22b,local_250);
  bVar1 = TaggedInt::IsOverflow(2);
  if (bVar1) {
    local_268 = JavascriptNumber::NewInlined(2.0,this);
  }
  else {
    local_268 = TaggedInt::ToVarUnchecked(2);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x22c,local_268);
  bVar1 = TaggedInt::IsOverflow(3);
  if (bVar1) {
    local_280 = JavascriptNumber::NewInlined(3.0,this);
  }
  else {
    local_280 = TaggedInt::ToVarUnchecked(3);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x22d,local_280);
  bVar1 = TaggedInt::IsOverflow(4);
  if (bVar1) {
    local_298 = JavascriptNumber::NewInlined(4.0,this);
  }
  else {
    local_298 = TaggedInt::ToVarUnchecked(4);
  }
  JavascriptLibrary::AddMember(this_00,pDVar2,0x22e,local_298);
  JavascriptLibrary::AddMember(this_00,intlNativeInterfaces,0x22f,pDVar2);
  value_00 = JavascriptLibraryBase::GetFalse(&this_00->super_JavascriptLibraryBase);
  JavascriptLibrary::AddMember(this_00,intlNativeInterfaces,0x213,value_00);
  pDVar2 = JavascriptLibraryBase::GetIntlObject(&this_00->super_JavascriptLibraryBase);
  JavascriptLibrary::AddMember(this_00,intlNativeInterfaces,0xbb,pDVar2);
  DynamicObject::SetHasNoEnumerableProperties(intlNativeInterfaces,true);
  return true;
}

Assistant:

bool IntlEngineInterfaceExtensionObject::InitializeIntlNativeInterfaces(DynamicObject* intlNativeInterfaces, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        int initSlotCapacity = 0;

        // automatically get the initSlotCapacity from everything we are about to add to intlNativeInterfaces
#define INTL_ENTRY(id, func) initSlotCapacity++;
#include "IntlExtensionObjectBuiltIns.h"
#undef INTL_ENTRY

#define PROJECTED_ENUM(ClassName, VALUES) initSlotCapacity++;
PROJECTED_ENUMS(PROJECTED_ENUM)
#undef PROJECTED_ENUM

        // add capacity for platform.winglob and platform.FallbackSymbol
        initSlotCapacity += 2;

        typeHandler->Convert(intlNativeInterfaces, mode, initSlotCapacity);

        ScriptContext* scriptContext = intlNativeInterfaces->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

// gives each entrypoint a property ID on the intlNativeInterfaces library object
#define INTL_ENTRY(id, func) library->AddFunctionToLibraryObject(intlNativeInterfaces, Js::PropertyIds::##id, &IntlEngineInterfaceExtensionObject::EntryInfo::Intl_##func, 1);
#include "IntlExtensionObjectBuiltIns.h"
#undef INTL_ENTRY

        library->AddMember(intlNativeInterfaces, PropertyIds::FallbackSymbol, library->CreateSymbol(BuiltInPropertyRecords::_intlFallbackSymbol));

        DynamicObject * enumObj = nullptr;

// Projects the exact layout of our C++ enums into Intl.js so that we dont have to remember to keep them in sync
#define ENUM_VALUE(enumName, propId, value) library->AddMember(enumObj, PropertyIds::##propId, JavascriptNumber::ToVar(value, scriptContext));
#define PROJECTED_ENUM(ClassName, VALUES) \
    enumObj = library->CreateObject(); \
    VALUES(ENUM_VALUE) \
    library->AddMember(intlNativeInterfaces, PropertyIds::##ClassName, enumObj); \

PROJECTED_ENUMS(PROJECTED_ENUM)

#undef PROJECTED_ENUM
#undef ENUM_VALUE

#if INTL_WINGLOB
        library->AddMember(intlNativeInterfaces, Js::PropertyIds::winglob, library->GetTrue());
#else
        library->AddMember(intlNativeInterfaces, Js::PropertyIds::winglob, library->GetFalse());

#if defined(NTBUILD)
        // when using ICU, we can call ulocdata_getCLDRVersion to ensure that ICU is functioning properly before allowing Intl to continue.
        // ulocdata_getCLDRVersion will cause the data file to be loaded, and if we don't have enough memory to do so, we can throw OutOfMemory here.
        // This is to protect against spurious U_MISSING_RESOURCE_ERRORs and U_FILE_ACCESS_ERRORs coming from early-lifecycle
        // functions that require ICU data.
        // See OS#16897150, OS#16896933, and others relating to bad statuses returned by GetLocaleData and IsLocaleAvailable
        // This was initially attempted using u_init, however u_init does not work with Node's default small-icu data file
        // because it contains no converters.
        UErrorCode status = U_ZERO_ERROR;
        UVersionInfo cldrVersion;
        ulocdata_getCLDRVersion(cldrVersion, &status);
        if (status == U_MEMORY_ALLOCATION_ERROR || status == U_FILE_ACCESS_ERROR || status == U_MISSING_RESOURCE_ERROR)
        {
            // Trace that this happens in case there are build system changes that actually cause the data file to be not found
            INTL_TRACE("Could not initialize ICU - ulocdata_getCLDRVersion returned status %S", u_errorName(status));
            Throw::OutOfMemory();
        }
        else
        {
            INTL_TRACE("Using CLDR version %d.%d.%d.%d", cldrVersion[0], cldrVersion[1], cldrVersion[2], cldrVersion[3]);
        }

        AssertOrFailFastMsg(U_SUCCESS(status), "ulocdata_getCLDRVersion returned non-OOM failure");
#endif // defined(NTBUILD)
#endif // else !INTL_WINGLOB

        // Add a reference to the built-in Intl object that can be referenced from the init code in Intl.js.
        library->AddMember(intlNativeInterfaces, Js::PropertyIds::Intl, library->GetIntlObject());

        intlNativeInterfaces->SetHasNoEnumerableProperties(true);

        return true;
    }